

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDescriptor.cpp
# Opt level: O3

void normVector(vector<float,_std::allocator<float>_> *v)

{
  float fVar1;
  pointer pfVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  
  pfVar2 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  fVar5 = 0.0;
  lVar3 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    lVar4 = 0;
    do {
      fVar1 = pfVar2[lVar4];
      fVar5 = fVar5 + fVar1 * fVar1;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  pfVar2 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    lVar4 = 0;
    do {
      pfVar2[lVar4] = pfVar2[lVar4] / fVar5;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return;
}

Assistant:

void normVector(vector<float>& v) {
	float sum = 0.0F;
	for (int i = 0; i < v.size(); ++i) {
		sum += v[i] * v[i];
	}
	sum = sqrtf(sum);
	for (int i = 0; i < v.size(); ++i) {
		v[i] /= sum;
	}
}